

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_JUnitOutputTest_TestCaseBlockWithAPackageName_TestShell::
~TEST_JUnitOutputTest_TestCaseBlockWithAPackageName_TestShell
          (TEST_JUnitOutputTest_TestCaseBlockWithAPackageName_TestShell *this)

{
  TEST_JUnitOutputTest_TestCaseBlockWithAPackageName_TestShell *this_local;
  
  ~TEST_JUnitOutputTest_TestCaseBlockWithAPackageName_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(JUnitOutputTest, TestCaseBlockWithAPackageName)
{
    junitOutput->setPackageName("packagename");
    testCaseRunner->start()
            .withGroup("groupname").withTest("testname")
            .end();

    outputFile = fileSystem.file("cpputest_packagename_groupname.xml");

    STRCMP_EQUAL("<testcase classname=\"packagename.groupname\" name=\"testname\" assertions=\"0\" time=\"0.000\" file=\"file\" line=\"1\">\n", outputFile->line(5));
    STRCMP_EQUAL("</testcase>\n", outputFile->line(6));
}